

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O0

char * __cxxabiv1::(anonymous_namespace)::
       parse_floating_number<float,__cxxabiv1::(anonymous_namespace)::Db>
                 (char *first,char *last,Db *db)

{
  int iVar1;
  string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
  *in_RDX;
  long in_RSI;
  char *in_RDI;
  int n;
  char num [24];
  uint d0;
  uint d1;
  char *e;
  char *t;
  anon_union_4_2_325080ff anon_var_0;
  size_t N;
  value_type *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  int local_e8;
  char local_d0 [100];
  uint local_6c;
  char local_68 [32];
  int local_48;
  int local_44;
  float *local_40;
  char *local_38;
  float local_2c [3];
  string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
  *local_20;
  char *local_18;
  char *local_10;
  
  local_2c[1] = 1.12104e-44;
  local_2c[2] = 0.0;
  local_10 = in_RDI;
  if (8 < (ulong)(in_RSI - (long)in_RDI)) {
    local_18 = in_RDI + 8;
    local_40 = local_2c;
    local_20 = in_RDX;
    for (local_38 = in_RDI; local_38 != local_18; local_38 = local_38 + 1) {
      iVar1 = isxdigit((int)*local_38);
      if (iVar1 == 0) {
        return local_10;
      }
      iVar1 = isdigit((int)*local_38);
      if (iVar1 == 0) {
        local_e8 = *local_38 + -0x57;
      }
      else {
        local_e8 = *local_38 + -0x30;
      }
      local_44 = local_e8;
      local_38 = local_38 + 1;
      iVar1 = isdigit((int)*local_38);
      if (iVar1 == 0) {
        in_stack_ffffffffffffff14 = *local_38 + -0x57;
      }
      else {
        in_stack_ffffffffffffff14 = *local_38 + -0x30;
      }
      *(char *)local_40 = (char)(local_44 << 4) + (char)in_stack_ffffffffffffff14;
      local_40 = (float *)((long)local_40 + 1);
      local_48 = in_stack_ffffffffffffff14;
    }
    if (*local_38 == 'E') {
      std::reverse<char*>((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          in_stack_ffffffffffffff08);
      memset(local_68,0,0x18);
      local_6c = snprintf(local_68,0x18,"%af",(double)local_2c[0]);
      if (0x17 < local_6c) {
        return local_10;
      }
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::basic_string((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                      *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),local_d0,
                     (size_type)local_20,(malloc_alloc<char> *)in_stack_fffffffffffffef8);
      anon_unknown_0::
      string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
      ::string_pair(local_20,&in_stack_fffffffffffffef8->first);
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                   *)local_20,in_stack_fffffffffffffef8);
      anon_unknown_0::
      string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
      ::~string_pair(local_20);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::~basic_string((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                       *)0x201f42);
      local_10 = local_38 + 1;
    }
  }
  return local_10;
}

Assistant:

const char*
parse_floating_number(const char* first, const char* last, C& db)
{
    const size_t N = float_data<Float>::mangled_size;
    if (static_cast<std::size_t>(last - first) > N)
    {
        last = first + N;
        union
        {
            Float value;
            char buf[sizeof(Float)];
        };
        const char* t = first;
        char* e = buf;
        for (; t != last; ++t, ++e)
        {
            if (!isxdigit(*t))
                return first;
            unsigned d1 = isdigit(*t) ? static_cast<unsigned>(*t - '0') :
                                        static_cast<unsigned>(*t - 'a' + 10);
            ++t;
            unsigned d0 = isdigit(*t) ? static_cast<unsigned>(*t - '0') :
                                        static_cast<unsigned>(*t - 'a' + 10);
            *e = static_cast<char>((d1 << 4) + d0);
        }
        if (*t == 'E')
        {
#if __BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__
            std::reverse(buf, e);
#endif
            char num[float_data<Float>::max_demangled_size] = {0};
            int n = snprintf(num, sizeof(num), float_data<Float>::spec, value);
            if (static_cast<std::size_t>(n) >= sizeof(num))
                return first;
            db.names.push_back(typename C::String(num, static_cast<std::size_t>(n)));
            first = t+1;
        }
    }
    return first;
}